

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O1

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariable(cmCommandArgumentParserHelper *this,char *var)

{
  pointer pcVar1;
  bool bVar2;
  cmMakefile *pcVar3;
  Snapshot snapshot;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  cmake *this_00;
  pointer pcVar9;
  char *__s;
  cmListFileContext lfc;
  ostringstream ostr;
  cmOutputConverter converter;
  allocator local_30d;
  allocator local_30c;
  allocator local_30b;
  allocator local_30a;
  allocator local_309;
  undefined1 local_308 [32];
  _Alloc_hider local_2e8;
  size_type local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  long local_2c8;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  PositionType local_1d0;
  undefined1 local_1c8 [112];
  ios_base local_158 [264];
  cmOutputConverter local_50;
  
  if (var == (char *)0x0) {
    return (char *)0x0;
  }
  if ((-1 < this->FileLine) && (iVar6 = strcmp(var,"CMAKE_CURRENT_LIST_LINE"), iVar6 == 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::ostream::_M_insert<long>((long)local_1c8);
    std::__cxx11::stringbuf::str();
    pcVar8 = AddString(this,(string *)local_308);
    if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
      operator_delete((void *)local_308._0_8_,CONCAT71(local_308._17_7_,local_308[0x10]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
    return pcVar8;
  }
  pcVar3 = this->Makefile;
  pcVar1 = local_1c8 + 0x10;
  local_1c8._0_8_ = pcVar1;
  sVar7 = strlen(var);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,var,var + sVar7);
  pcVar8 = cmMakefile::GetDefinition(pcVar3,(string *)local_1c8);
  if ((pointer)local_1c8._0_8_ != pcVar1) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  if ((pcVar8 != (char *)0x0) || (this->RemoveEmpty != false)) {
    if ((pcVar8 == (char *)0x0) || (this->EscapeQuotes == false)) {
      __s = "";
      if (pcVar8 != (char *)0x0) {
        __s = pcVar8;
      }
      local_1c8._0_8_ = pcVar1;
      sVar7 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,__s,__s + sVar7);
      pcVar8 = AddString(this,(string *)local_1c8);
      pcVar9 = (pointer)local_1c8._0_8_;
      if ((pointer)local_1c8._0_8_ == pcVar1) {
        return pcVar8;
      }
    }
    else {
      local_308._0_8_ = local_308 + 0x10;
      sVar7 = strlen(pcVar8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_308,pcVar8,pcVar8 + sVar7);
      cmSystemTools::EscapeQuotes((string *)local_1c8,(string *)local_308);
      pcVar8 = AddString(this,(string *)local_1c8);
      if ((pointer)local_1c8._0_8_ != pcVar1) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
      }
      if ((undefined1 *)local_308._0_8_ == local_308 + 0x10) {
        return pcVar8;
      }
      local_1c8._16_8_ = CONCAT71(local_308._17_7_,local_308[0x10]);
      pcVar9 = (pointer)local_308._0_8_;
    }
    operator_delete(pcVar9,local_1c8._16_8_ + 1);
    return pcVar8;
  }
  bVar2 = this->WarnUninitialized;
  if (bVar2 == true) {
    pcVar3 = this->Makefile;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    sVar7 = strlen(var);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,var,var + sVar7);
    bVar4 = cmMakefile::VariableInitialized(pcVar3,&local_2a0);
    bVar4 = !bVar4;
  }
  else {
    bVar4 = false;
  }
  if ((bVar2 != false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2)) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return (char *)0x0;
  }
  bVar2 = this->CheckSystemVars;
  bVar4 = true;
  if (bVar2 == false) {
    std::__cxx11::string::string((string *)&local_200,this->FileName,&local_309);
    pcVar8 = cmMakefile::GetHomeDirectory(this->Makefile);
    std::__cxx11::string::string((string *)&local_220,pcVar8,&local_30a);
    bVar5 = cmsys::SystemTools::IsSubDirectory(&local_200,&local_220);
    if (!bVar5) {
      std::__cxx11::string::string((string *)&local_240,this->FileName,&local_30b);
      pcVar8 = cmMakefile::GetHomeOutputDirectory(this->Makefile);
      std::__cxx11::string::string((string *)&local_260,pcVar8,&local_30c);
      bVar4 = cmsys::SystemTools::IsSubDirectory(&local_240,&local_260);
      bVar5 = true;
      goto LAB_0039576b;
    }
  }
  bVar5 = false;
LAB_0039576b:
  if (bVar5) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar2 == false) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar4 != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    local_308._8_8_ = 0;
    local_308[0x10] = '\0';
    local_2e0 = 0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8 = 0;
    local_308._0_8_ = local_308 + 0x10;
    local_2e8._M_p = (pointer)&local_2d8;
    cmMakefile::GetStateSnapshot(this->Makefile);
    snapshot.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)uStack_1d8;
    snapshot.State = (cmState *)local_1e0;
    snapshot.Position.Position = local_1d0;
    cmOutputConverter::cmOutputConverter(&local_50,snapshot);
    std::__cxx11::string::string((string *)&local_280,this->FileName,&local_30d);
    cmOutputConverter::Convert(&local_2c0,&local_50,&local_280,HOME,UNCHANGED);
    std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    local_2c8 = this->FileLine;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"uninitialized variable \'",0x18);
    sVar7 = strlen(var);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,var,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\'",1);
    this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
    std::__cxx11::stringbuf::str();
    cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_2c0,(cmListFileContext *)local_308,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_p != &local_2d8) {
      operator_delete(local_2e8._M_p,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
      operator_delete((void *)local_308._0_8_,CONCAT71(local_308._17_7_,local_308[0x10]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
  }
  return (char *)0x0;
}

Assistant:

char* cmCommandArgumentParserHelper::ExpandVariable(const char* var)
{
  if(!var)
    {
    return 0;
    }
  if(this->FileLine >= 0 && strcmp(var, "CMAKE_CURRENT_LIST_LINE") == 0)
    {
    std::ostringstream ostr;
    ostr << this->FileLine;
    return this->AddString(ostr.str());
    }
  const char* value = this->Makefile->GetDefinition(var);
  if(!value && !this->RemoveEmpty)
    {
    // check to see if we need to print a warning
    // if strict mode is on and the variable has
    // not been "cleared"/initialized with a set(foo ) call
    if(this->WarnUninitialized && !this->Makefile->VariableInitialized(var))
      {
      if (this->CheckSystemVars ||
          cmSystemTools::IsSubDirectory(this->FileName,
                                        this->Makefile->GetHomeDirectory()) ||
          cmSystemTools::IsSubDirectory(this->FileName,
                                     this->Makefile->GetHomeOutputDirectory()))
        {
        std::ostringstream msg;
        cmListFileContext lfc;
        cmOutputConverter converter(this->Makefile->GetStateSnapshot());
        lfc.FilePath = converter.Convert(this->FileName,
                                         cmOutputConverter::HOME);

        lfc.Line = this->FileLine;
        msg << "uninitialized variable \'" << var << "\'";
        this->Makefile->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING,
                                                        msg.str(), lfc);
        }
      }
    return 0;
    }
  if (this->EscapeQuotes && value)
    {
    return this->AddString(cmSystemTools::EscapeQuotes(value));
    }
  return this->AddString(value ? value : "");
}